

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutexBenchmarks.hpp
# Opt level: O3

void benchmarks::MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex>::Basic
               (BenchmarkContext *context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong count;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  StorageArray<boost::recursive_mutex> m;
  string local_58;
  anon_class_8_1_54a3980d local_38;
  StorageArray<boost::recursive_mutex> local_30;
  
  count = context->_iterationsCount;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = count;
  uVar3 = SUB168(auVar2 * ZEXT816(0x28),0);
  uVar4 = uVar3 + 8;
  if (0xfffffffffffffff7 < uVar3) {
    uVar4 = 0xffffffffffffffff;
  }
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x28),8) == 0) {
    uVar3 = uVar4;
  }
  local_30._size = count;
  puVar5 = (ulong *)operator_new__(uVar3);
  *puVar5 = count;
  local_30._arr = (Storage<boost::recursive_mutex> *)(puVar5 + 1);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"create","");
  local_38.m = &local_30;
  BenchmarkContext::
  Profile<benchmarks::MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex>::Basic(benchmarks::BenchmarkContext&)::_lambda()_1_>
            (context,&local_58,count,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"mutex","");
  (*context->_vptr_BenchmarkContext[2])(context,&local_58,count);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"lock","");
  local_38.m = &local_30;
  BenchmarkContext::
  Profile<benchmarks::MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex>::Basic(benchmarks::BenchmarkContext&)::_lambda()_2_>
            (context,&local_58,count,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"unlock","");
  local_38.m = &local_30;
  BenchmarkContext::
  Profile<benchmarks::MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex>::Basic(benchmarks::BenchmarkContext&)::_lambda()_3_>
            (context,&local_58,count,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"destroy","");
  local_38.m = &local_30;
  BenchmarkContext::
  Profile<benchmarks::MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex>::Basic(benchmarks::BenchmarkContext&)::_lambda()_4_>
            (context,&local_58,count,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_30._arr != (Storage<boost::recursive_mutex> *)0x0) {
    operator_delete__((ulong *)((long)local_30._arr + -8));
  }
  return;
}

Assistant:

static void Basic(BenchmarkContext& context)
        {
            const auto n = context.GetIterationsCount();

            StorageArray<MutexType> m(n);

            context.Profile("create", n, [&]{ m.Construct(); });
            context.MeasureMemory("mutex", n);
            context.Profile("lock", n, [&]{ m.ForEach([](MutexType& m){ m.lock(); }); });
            context.Profile("unlock", n, [&]{ m.ForEach([](MutexType& m){ m.unlock(); }); });
            context.Profile("destroy", n, [&]{ m.Destruct(); });
        }